

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandler * __thiscall
Js::NullTypeHandlerBase::ConvertToSimpleDictionaryType
          (NullTypeHandlerBase *this,DynamicObject *instance)

{
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar1;
  ScriptContext *pSVar2;
  SimpleDictionaryTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pSVar1 = ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertNullToSimpleDictionaryCount = pSVar2->convertNullToSimpleDictionaryCount + 1;
  return pSVar1;
}

Assistant:

SimpleDictionaryTypeHandler * NullTypeHandlerBase::ConvertToSimpleDictionaryType(DynamicObject * instance)
    {
        SimpleDictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<SimpleDictionaryTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertNullToSimpleDictionaryCount++;
#endif
        return newTypeHandler;
    }